

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O1

_Bool square_isinemptysquare(chunk_conflict *c,loc grid)

{
  bool bVar1;
  wchar_t wVar2;
  bool bVar3;
  _Bool _Var4;
  square *psVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  loc grid_00;
  wchar_t wVar8;
  
  wVar6 = grid.x + L'\xfffffffd';
  wVar7 = grid.y + L'\x02';
  bVar3 = false;
  wVar8 = wVar6;
  wVar2 = grid.y + L'\xfffffffe';
  while( true ) {
    wVar8 = wVar8 + L'\x01';
    grid_00.y = wVar2;
    grid_00.x = wVar8;
    _Var4 = square_in_bounds(c,grid_00);
    if (!_Var4) {
      return bVar3;
    }
    psVar5 = square(c,grid_00);
    _Var4 = flag_has_dbg(f_info[psVar5->feat].flags,6,0xf,"f_info[feat].flags","TF_FLOOR");
    if (!_Var4) break;
    if (grid.x + L'\x02' <= wVar8) {
      bVar3 = wVar7 <= wVar2;
      bVar1 = wVar7 <= wVar2;
      wVar8 = wVar6;
      wVar2 = wVar2 + L'\x01';
      if (bVar1) {
        return bVar3;
      }
    }
  }
  return bVar3;
}

Assistant:

bool square_isinemptysquare(struct chunk *c, struct loc grid)
{
	struct loc test;
	for (test.y = grid.y - 2; test.y <= grid.y + 2; test.y++) {
		for (test.x = grid.x - 2; test.x <= grid.x + 2; test.x++) {
			if (!square_in_bounds(c, test)) return false;
			if (!square_isfloor(c, test)) return false;
		}
	}
	return true;
}